

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

void Acb_DeriveCnfForWindowOne(Acb_Ntk_t *p,int iObj)

{
  uint uVar1;
  word Truth;
  int nVars;
  Vec_Str_t *p_00;
  char *pcVar2;
  
  p_00 = Acb_ObjCnfs(p,iObj);
  if (p_00->nSize == 0) {
    if ((p->vCnfs).nSize == (p->vObjType).nSize) {
      if (iObj < 1) {
        pcVar2 = "i>0";
      }
      else {
        uVar1 = (p->vObjTruth).nSize;
        if (0 < (int)uVar1) {
          if ((uint)iObj < uVar1) {
            Truth = (p->vObjTruth).pArray[(uint)iObj];
            nVars = Acb_ObjFaninNum(p,iObj);
            Acb_DeriveCnfFromTruth(Truth,nVars,&p->vCover,&p->vCnf);
            Vec_StrGrow(p_00,(p->vCnf).nSize);
            memcpy(p_00->pArray,(p->vCnf).pArray,(long)(p->vCnf).nSize);
            p_00->nSize = (p->vCnf).nSize;
            return;
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                        ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
        }
        pcVar2 = "Acb_NtkHasObjTruths(p)";
      }
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                    ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
    }
    pcVar2 = "Vec_WecSize(vCnfs) == Acb_NtkObjNumMax(p)";
    uVar1 = 0x62;
  }
  else {
    pcVar2 = "Vec_StrSize(vCnfBase) == 0";
    uVar1 = 0x61;
  }
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                ,uVar1,"void Acb_DeriveCnfForWindowOne(Acb_Ntk_t *, int)");
}

Assistant:

void Acb_DeriveCnfForWindowOne( Acb_Ntk_t * p, int iObj )
{
    Vec_Wec_t * vCnfs = &p->vCnfs;
    Vec_Str_t * vCnfBase = Acb_ObjCnfs( p, iObj );
    assert( Vec_StrSize(vCnfBase) == 0 ); // unassigned
    assert( Vec_WecSize(vCnfs) == Acb_NtkObjNumMax(p) );
    Acb_DeriveCnfFromTruth( Acb_ObjTruth(p, iObj), Acb_ObjFaninNum(p, iObj), &p->vCover, &p->vCnf );
    Vec_StrGrow( vCnfBase, Vec_StrSize(&p->vCnf) );
    memcpy( Vec_StrArray(vCnfBase), Vec_StrArray(&p->vCnf), (size_t)Vec_StrSize(&p->vCnf) );
    vCnfBase->nSize = Vec_StrSize(&p->vCnf);
}